

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

void gravity_function_serialize(gravity_function_t *f,json_t *json)

{
  char *key;
  char *label;
  char temp [256];
  char **local_20;
  char *identifier;
  json_t *json_local;
  gravity_function_t *f_local;
  
  if (f->tag == EXEC_TYPE_SPECIAL) {
    gravity_function_special_serialize(f,f->identifier,json);
  }
  else {
    local_20 = (char **)f->identifier;
    if (local_20 == (char **)0x0) {
      snprintf((char *)&label,0x100,"$anon_%p",f);
      local_20 = &label;
    }
    key = json_get_label(json,(char *)local_20);
    json_begin_object(json,key);
    json_add_cstring(json,"type","function");
    json_add_cstring(json,"identifier",(char *)local_20);
    json_add_int(json,"tag",(ulong)f->tag);
    json_add_int(json,"nparam",(ulong)f->nparams);
    json_add_bool(json,"args",(_Bool)((f->field_9).field_0.useargs & 1));
    if (f->tag == EXEC_TYPE_NATIVE) {
      json_add_int(json,"nlocal",(ulong)f->nlocals);
      json_add_int(json,"ntemp",(ulong)f->ntemps);
      json_add_int(json,"nup",(ulong)f->nupvalues);
      json_add_double(json,"purity",(double)(f->field_9).field_0.purity);
      gravity_function_bytecode_serialize(f,json);
      json_begin_array(json,"pool");
      gravity_function_array_serialize(f,json,(f->field_9).field_0.cpool);
      json_end_array(json);
      if ((f->field_9).field_0.pvalue.n != 0) {
        json_begin_array(json,"pvalues");
        gravity_function_array_serialize(f,json,(f->field_9).field_0.pvalue);
        json_end_array(json);
      }
      if ((f->field_9).field_0.pname.n != 0) {
        json_begin_array(json,"pnames");
        gravity_function_array_serialize(f,json,(f->field_9).field_0.pname);
        json_end_array(json);
      }
    }
    json_end_object(json);
  }
  return;
}

Assistant:

void gravity_function_serialize (gravity_function_t *f, json_t *json) {
    // special functions need a special serialization
    if (f->tag == EXEC_TYPE_SPECIAL) {
        gravity_function_special_serialize(f, f->identifier, json);
        return;
    }

    // compute identifier (cannot be NULL)
    const char *identifier = f->identifier;
    char temp[256];
    if (!identifier) {snprintf(temp, sizeof(temp), "$anon_%p", f); identifier = temp;}

    const char *label = json_get_label(json, identifier);
    json_begin_object(json, label);
    
    json_add_cstring(json, GRAVITY_JSON_LABELTYPE, GRAVITY_JSON_FUNCTION);  // MANDATORY 1st FIELD
    json_add_cstring(json, GRAVITY_JSON_LABELIDENTIFIER, identifier);       // MANDATORY 2nd FIELD (not for getter/setter)
    json_add_int(json, GRAVITY_JSON_LABELTAG, f->tag);

    // common fields
    json_add_int(json, GRAVITY_JSON_LABELNPARAM, f->nparams);
    json_add_bool(json, GRAVITY_JSON_LABELARGS, f->useargs);

    if (f->tag == EXEC_TYPE_NATIVE) {
        // native only fields
        json_add_int(json, GRAVITY_JSON_LABELNLOCAL, f->nlocals);
        json_add_int(json, GRAVITY_JSON_LABELNTEMP, f->ntemps);
        json_add_int(json, GRAVITY_JSON_LABELNUPV, f->nupvalues);
        json_add_double(json, GRAVITY_JSON_LABELPURITY, f->purity);

        // bytecode
        gravity_function_bytecode_serialize(f, json);

        // constant pool
        json_begin_array(json, GRAVITY_JSON_LABELPOOL);
        gravity_function_array_serialize(f, json, f->cpool);
        json_end_array(json);
        
        // default values (if any)
        if (marray_size(f->pvalue)) {
            json_begin_array(json, GRAVITY_JSON_LABELPVALUES);
            gravity_function_array_serialize(f, json, f->pvalue);
        json_end_array(json);
    }

        // arg names (if any)
        if (marray_size(f->pname)) {
            json_begin_array(json, GRAVITY_JSON_LABELPNAMES);
            gravity_function_array_serialize(f, json, f->pname);
            json_end_array(json);
        }
    }
    
    json_end_object(json);
}